

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall Am_Slot_Iterator::Start(Am_Slot_Iterator *this)

{
  uint *puVar1;
  Am_Slot_Iterator_Data *pAVar2;
  Am_Object_Data *pAVar3;
  
  pAVar3 = (this->context).data;
  if ((pAVar3 != (Am_Object_Data *)0x0) && ((pAVar3->data).data != (char *)0x0)) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    pAVar3 = Am_Object_Data::Narrow(&pAVar3->super_Am_Wrapper);
    pAVar2 = this->data;
    pAVar2->curr_obj = pAVar3;
    pAVar2->curr_pos = 0;
    pAVar3 = (this->context).data;
    if (pAVar3 != (Am_Object_Data *)0x0) {
      puVar1 = &(pAVar3->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
    }
    pAVar3 = Am_Object_Data::Narrow(&pAVar3->super_Am_Wrapper);
    Am_Slot_Iterator_Data::Find_Actual(this->data,pAVar3);
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar3->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar3);
      return;
    }
  }
  return;
}

Assistant:

void
Am_Slot_Iterator::Start()
{
  if (context.Valid()) {
    data->curr_obj = Am_Object_Data::Narrow(context);
    data->curr_pos = 0;
    Am_Object_Data *cont_data = Am_Object_Data::Narrow(context);
    data->Find_Actual(cont_data);
    cont_data->Release();
  }
}